

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O0

void lwsl_emit_stderr(int level,char *line)

{
  int iVar1;
  int local_60;
  uint local_5c;
  int m;
  int n;
  char buf [50];
  char *line_local;
  int level_local;
  
  local_60 = 0xb;
  if (tty == '\0') {
    iVar1 = isatty(2);
    tty = (byte)iVar1 | 2;
  }
  lwsl_timestamp(level,(char *)&m,0x32);
  if (tty == '\x03') {
    for (local_5c = 0x800; (local_5c != 0 && ((level & local_5c) == 0));
        local_5c = (int)local_5c >> 1) {
      local_60 = local_60 + -1;
    }
    fprintf(_stderr,"%c%s%s%s%c[0m",0x1b,colours[local_60],&m,line,0x1b);
  }
  else {
    fprintf(_stderr,"%s%s",&m,line);
  }
  return;
}

Assistant:

void
lwsl_emit_stderr(int level, const char *line)
{
	char buf[50];
	int n, m = LWS_ARRAY_SIZE(colours) - 1;

	if (!tty)
		tty = isatty(2) | 2;
	lwsl_timestamp(level, buf, sizeof(buf));

	if (tty == 3) {
		n = 1 << (LWS_ARRAY_SIZE(colours) - 1);
		while (n) {
			if (level & n)
				break;
			m--;
			n >>= 1;
		}
		fprintf(stderr, "%c%s%s%s%c[0m", 27, colours[m], buf, line, 27);
	} else
		fprintf(stderr, "%s%s", buf, line);
}